

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PushPopTest.cpp
# Opt level: O2

void __thiscall
PushPopTest_RandomOrder_Test::PushPopTest_RandomOrder_Test(PushPopTest_RandomOrder_Test *this)

{
  PushPopTest::PushPopTest(&this->super_PushPopTest);
  (this->super_PushPopTest).super_TestWithParam<unsigned_long>.super_Test._vptr_Test =
       (_func_int **)&PTR__PushPopTest_00161a40;
  (this->super_PushPopTest).super_TestWithParam<unsigned_long>.
  super_WithParamInterface<unsigned_long>._vptr_WithParamInterface =
       (_func_int **)&PTR__PushPopTest_RandomOrder_Test_00161a80;
  return;
}

Assistant:

TEST_P(PushPopTest, RandomOrder) {
    std::size_t n = GetParam();

    for (std::size_t i = 0; i < n; ++i) {
        int x = nextRandom();
        myDeque.push_back(x);
        stdDeque.push_back(x);
        int y = nextRandom();
        myDeque.push_front(y);
        stdDeque.push_front(y);
    }

    ASSERT_EQ(myDeque.size(), stdDeque.size());

    while (!stdDeque.empty()) {
        int s = stdDeque.back();
        int m = myDeque.back();
        ASSERT_EQ(s, m);
        stdDeque.pop_back();
        myDeque.pop_back();
    }
}